

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkUpgradeToStruct
          (CompatibilityChecker *this,Reader *type,uint64_t structTypeId,
          Maybe<capnp::schema::Node::Reader> *matchSize,
          Maybe<capnp::schema::Field::Reader> *matchPosition)

{
  ushort uVar1;
  uint uVar2;
  undefined4 uVar3;
  void *pvVar4;
  void *pvVar5;
  WirePointer *pWVar6;
  Impl *this_00;
  CapTableBuilder *pCVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  SegmentBuilder *pSVar11;
  Maybe<capnp::schema::Field::Reader> *params_2;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ArrayPtr<capnp::word> firstSegment;
  Reader value_00;
  Reader value_01;
  Builder value;
  Builder field;
  Builder result;
  Builder node;
  MallocMessageBuilder builder;
  word scratch [32];
  StructReader local_338;
  StructBuilder local_308;
  OrphanBuilder local_2d8;
  CompatibilityChecker *local_2b0;
  StructBuilder local_2a8;
  PointerBuilder local_278;
  StructReader local_258;
  MallocMessageBuilder local_228;
  word local_138 [33];
  
  params_2 = matchPosition;
  local_2b0 = this;
  memset(local_138,0,0x100);
  firstSegment.size_ = 0x20;
  firstSegment.ptr = local_138;
  MallocMessageBuilder::MallocMessageBuilder(&local_228,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_308,&local_228.super_MessageBuilder);
  local_338.data = local_308.data;
  local_338.segment = &(local_308.segment)->super_SegmentReader;
  local_338.capTable = &(local_308.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::initStruct(&local_2a8,(PointerBuilder *)&local_338,(StructSize)0x60006);
  *(uint64_t *)local_2a8.data = structTypeId;
  kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
            ((String *)&local_308,(kj *)"(unknown type used in ",(char (*) [23])&local_2b0->nodeName
             ,(Reader *)0x502b17,(char (*) [2])params_2);
  pSVar11 = local_308.segment;
  if ((SegmentBuilder *)local_308.capTable == (SegmentBuilder *)0x0) {
    pSVar11 = (SegmentBuilder *)0x524569;
  }
  value_00.super_StringPtr.content.size_ =
       (long)&((SegmentReader *)&(local_308.capTable)->super_CapTableReader)->arena +
       (ulong)((SegmentBuilder *)local_308.capTable == (SegmentBuilder *)0x0);
  local_338.segment = &(local_2a8.segment)->super_SegmentReader;
  local_338.capTable = &(local_2a8.capTable)->super_CapTableReader;
  local_338.data = local_2a8.pointers;
  value_00.super_StringPtr.content.ptr = (char *)pSVar11;
  capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_338,value_00);
  pCVar7 = local_308.capTable;
  pSVar11 = local_308.segment;
  if (local_308.segment != (SegmentBuilder *)0x0) {
    local_308.segment = (SegmentBuilder *)0x0;
    local_308.capTable = (CapTableBuilder *)0x0;
    (*(code *)**local_308.data)(local_308.data,pSVar11,1,pCVar7,pCVar7,0);
  }
  *(undefined4 *)((long)local_2a8.data + 0xc) = 1;
  *(undefined4 *)((long)local_2a8.data + 0x18) = 0;
  *(byte *)((long)local_2a8.data + 0x1c) = *(byte *)((long)local_2a8.data + 0x1c) & 0xfe;
  *(undefined2 *)((long)local_2a8.data + 0x1e) = 0;
  *(undefined4 *)((long)local_2a8.data + 0x20) = 0;
  local_338.data = local_2a8.pointers + 3;
  local_338.segment = &(local_2a8.segment)->super_SegmentReader;
  local_338.capTable = &(local_2a8.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::clear((PointerBuilder *)&local_338);
  if ((type->_reader).dataSize < 0x10) {
    uVar9 = 0;
    uVar8 = 0;
LAB_0037f5c0:
    *(undefined2 *)((long)local_2a8.data + 0xe) = uVar9;
    *(undefined2 *)((long)local_2a8.data + 0x18) = uVar8;
  }
  else {
    uVar1 = *(type->_reader).data;
    if (uVar1 < 0x13) {
      uVar2 = (uint)uVar1 * 2;
      uVar9 = *(undefined2 *)(&DAT_00570bb2 + uVar2);
      uVar8 = *(undefined2 *)(&DAT_00570bd8 + uVar2);
      goto LAB_0037f5c0;
    }
  }
  if ((matchSize->ptr).isSet == true) {
    uVar2 = *(uint *)((long)&(matchSize->ptr).field_1 + 0x20);
    if (uVar2 < 0x80) {
      *(undefined2 *)((long)local_2a8.data + 0xe) = 0;
LAB_0037f5f6:
      uVar9 = 0;
    }
    else {
      pvVar4 = (matchSize->ptr).field_1.value._reader.data;
      *(undefined2 *)((long)local_2a8.data + 0xe) = *(undefined2 *)((long)pvVar4 + 0xe);
      if (uVar2 < 0xd0) goto LAB_0037f5f6;
      uVar9 = *(undefined2 *)((long)pvVar4 + 0x18);
    }
    *(undefined2 *)((long)local_2a8.data + 0x18) = uVar9;
  }
  local_2d8.capTable = (CapTableBuilder *)(local_2a8.pointers + 3);
  local_2d8.tag.content = (uint64_t)local_2a8.segment;
  local_2d8.segment = (SegmentBuilder *)local_2a8.capTable;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)&local_338,(PointerBuilder *)&local_2d8,1,(StructSize)0x40003);
  capnp::_::ListBuilder::getStructElement(&local_308,(ListBuilder *)&local_338,0);
  local_338.segment = &(local_308.segment)->super_SegmentReader;
  local_338.capTable = &(local_308.capTable)->super_CapTableReader;
  local_338.data = local_308.pointers;
  value_01.super_StringPtr.content.size_ = 8;
  value_01.super_StringPtr.content.ptr = "member0";
  capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_338,value_01);
  *(undefined2 *)local_308.data = 0;
  *(undefined2 *)((long)local_308.data + 8) = 0;
  *(undefined4 *)((long)local_308.data + 4) = 0;
  *(byte *)((long)local_308.data + 0x10) = *(byte *)((long)local_308.data + 0x10) & 0xfe;
  local_338.data = local_308.pointers + 2;
  local_338.segment = &(local_308.segment)->super_SegmentReader;
  local_338.capTable = &(local_308.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::clear((PointerBuilder *)&local_338);
  local_338.data = local_308.pointers + 3;
  local_338.segment = &(local_308.segment)->super_SegmentReader;
  local_338.capTable = &(local_308.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::clear((PointerBuilder *)&local_338);
  pvVar4 = local_308.data;
  pCVar7 = local_308.capTable;
  pSVar11 = local_308.segment;
  local_338.segment = (type->_reader).segment;
  local_338.capTable = (type->_reader).capTable;
  local_338.data = (type->_reader).data;
  local_338.pointers = (type->_reader).pointers;
  local_338.dataSize = (type->_reader).dataSize;
  local_338.pointerCount = (type->_reader).pointerCount;
  local_338._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
  local_338.nestingLimit = (type->_reader).nestingLimit;
  local_338._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
  local_2d8.capTable = (CapTableBuilder *)(local_308.pointers + 2);
  local_2d8.tag.content = (uint64_t)local_308.segment;
  local_2d8.segment = (SegmentBuilder *)local_308.capTable;
  capnp::_::PointerBuilder::setStruct((PointerBuilder *)&local_2d8,&local_338,false);
  if ((matchPosition->ptr).isSet == true) {
    uVar2 = *(uint *)((long)&(matchPosition->ptr).field_1 + 0x20);
    if ((uVar2 < 0x60) ||
       (pvVar5 = (matchPosition->ptr).field_1.value._reader.data, *(short *)((long)pvVar5 + 10) != 1
       )) {
      *(undefined2 *)((long)((long)local_308.data + 8) + 2) = 0;
    }
    else {
      if (uVar2 < 0x70) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined2 *)((long)pvVar5 + 0xc);
      }
      *(undefined2 *)((long)((long)local_308.data + 8) + 2) = 1;
      *(undefined2 *)((long)((long)local_308.data + 8) + 4) = uVar9;
    }
    pWVar6 = (matchPosition->ptr).field_1.value._reader.pointers;
    uVar1 = *(ushort *)((long)&(matchPosition->ptr).field_1 + 0x24);
    uVar3 = *(undefined4 *)((long)&(matchPosition->ptr).field_1 + 0x28);
    uVar10 = 0;
    if (0x3f < *(uint *)((long)&(matchPosition->ptr).field_1 + 0x20)) {
      uVar10 = *(undefined4 *)((long)(matchPosition->ptr).field_1.value._reader.data + 4);
    }
    uVar13 = *(undefined4 *)&(matchPosition->ptr).field_1;
    uVar14 = *(undefined4 *)((long)&(matchPosition->ptr).field_1 + 4);
    uVar15 = *(undefined4 *)((long)&(matchPosition->ptr).field_1 + 8);
    uVar16 = *(undefined4 *)((long)&(matchPosition->ptr).field_1 + 0xc);
    *(undefined4 *)((long)pvVar4 + 4) = uVar10;
    bVar12 = uVar1 < 4;
    local_338.data = pWVar6 + 3;
    if (bVar12) {
      local_338.data = (WirePointer *)0x0;
    }
    if (bVar12) {
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      uVar3 = 0x7fffffff;
    }
    local_338.segment = (SegmentReader *)CONCAT44(uVar14,uVar13);
    local_338.capTable = (CapTableReader *)CONCAT44(uVar16,uVar15);
    local_338.pointers = (WirePointer *)CONCAT44(local_338.pointers._4_4_,uVar3);
    capnp::_::PointerReader::getStruct(&local_258,(PointerReader *)&local_338,(word *)0x0);
    local_338.dataSize = local_258.dataSize;
    local_338.pointerCount = local_258.pointerCount;
    local_338._38_2_ = local_258._38_2_;
    local_338.nestingLimit = local_258.nestingLimit;
    local_338._44_4_ = local_258._44_4_;
    local_338.data = local_258.data;
    local_338.pointers = local_258.pointers;
    local_338.segment = local_258.segment;
    local_338.capTable = local_258.capTable;
    local_2d8.capTable = (CapTableBuilder *)(local_308.pointers + 3);
    local_2d8.tag.content = (uint64_t)pSVar11;
    local_2d8.segment = (SegmentBuilder *)pCVar7;
    capnp::_::PointerBuilder::setStruct((PointerBuilder *)&local_2d8,&local_338,false);
    goto switchD_0037f79c_default;
  }
  *(undefined4 *)((long)((long)local_308.data + 8) + 2) = 1;
  *(undefined4 *)((long)pvVar4 + 4) = 0;
  local_2d8.capTable = (CapTableBuilder *)(local_308.pointers + 3);
  local_2d8.tag.content = (uint64_t)pSVar11;
  local_2d8.segment = (SegmentBuilder *)pCVar7;
  capnp::_::PointerBuilder::initStruct
            ((StructBuilder *)&local_338,(PointerBuilder *)&local_2d8,(StructSize)0x10002);
  if ((type->_reader).dataSize < 0x10) {
switchD_0037f79c_caseD_0:
    *(undefined2 *)local_338.data = 0;
    goto switchD_0037f79c_default;
  }
  switch(*(type->_reader).data) {
  case 0:
    goto switchD_0037f79c_caseD_0;
  case 1:
    *(undefined2 *)local_338.data = 1;
    *(byte *)((long)local_338.data + 2) = *(byte *)((long)local_338.data + 2) & 0xfe;
    break;
  case 2:
    *(undefined2 *)local_338.data = 2;
    goto LAB_0037fa30;
  case 3:
    *(undefined4 *)local_338.data = 3;
    break;
  case 4:
    *(undefined2 *)local_338.data = 4;
    goto LAB_0037fa78;
  case 5:
    *(undefined2 *)local_338.data = 5;
    goto LAB_0037f9c8;
  case 6:
    *(undefined2 *)local_338.data = 6;
LAB_0037fa30:
    *(undefined1 *)((long)local_338.data + 2) = 0;
    break;
  case 7:
    *(undefined4 *)local_338.data = 7;
    break;
  case 8:
    *(undefined2 *)local_338.data = 8;
    goto LAB_0037fa78;
  case 9:
    *(undefined2 *)local_338.data = 9;
    goto LAB_0037f9c8;
  case 10:
    *(undefined2 *)local_338.data = 10;
LAB_0037fa78:
    *(undefined4 *)((long)local_338.data + 4) = 0;
    break;
  case 0xb:
    *(undefined2 *)local_338.data = 0xb;
LAB_0037f9c8:
    *(undefined8 *)((long)local_338.data + 8) = 0;
    break;
  case 0xc:
    local_2d8.capTable = (CapTableBuilder *)0x0;
    local_2d8.location = (word *)0x0;
    local_2d8.tag.content = 0;
    local_2d8.segment = (SegmentBuilder *)0x0;
    *(undefined2 *)local_338.data = 0xc;
    local_278.segment = (SegmentBuilder *)local_338.segment;
    local_278.capTable = (CapTableBuilder *)local_338.capTable;
    local_278.pointer = local_338.pointers;
    capnp::_::PointerBuilder::adopt(&local_278,&local_2d8);
    if (local_2d8.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(&local_2d8);
    }
    break;
  case 0xd:
    local_2d8.capTable = (CapTableBuilder *)0x0;
    local_2d8.location = (word *)0x0;
    local_2d8.tag.content = 0;
    local_2d8.segment = (SegmentBuilder *)0x0;
    *(undefined2 *)local_338.data = 0xd;
    local_278.segment = (SegmentBuilder *)local_338.segment;
    local_278.capTable = (CapTableBuilder *)local_338.capTable;
    local_278.pointer = local_338.pointers;
    capnp::_::PointerBuilder::adopt(&local_278,&local_2d8);
    if (local_2d8.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(&local_2d8);
    }
    break;
  case 0xe:
    *(undefined2 *)local_338.data = 0xe;
    local_2d8.tag.content = (uint64_t)local_338.segment;
    local_2d8.segment = (SegmentBuilder *)local_338.capTable;
    local_2d8.capTable = (CapTableBuilder *)local_338.pointers;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_2d8);
    break;
  case 0xf:
    *(undefined4 *)local_338.data = 0xf;
    break;
  case 0x10:
    *(undefined2 *)local_338.data = 0x10;
    local_2d8.tag.content = (uint64_t)local_338.segment;
    local_2d8.segment = (SegmentBuilder *)local_338.capTable;
    local_2d8.capTable = (CapTableBuilder *)local_338.pointers;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_2d8);
    break;
  case 0x11:
    *(undefined2 *)local_338.data = 0x11;
    break;
  case 0x12:
    *(undefined2 *)local_338.data = 0x12;
    local_2d8.tag.content = (uint64_t)local_338.segment;
    local_2d8.segment = (SegmentBuilder *)local_338.capTable;
    local_2d8.capTable = (CapTableBuilder *)local_338.pointers;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_2d8);
  }
switchD_0037f79c_default:
  this_00 = local_2b0->loader;
  capnp::_::StructBuilder::asReader(&local_2a8);
  Impl::load(this_00,(Reader *)&local_338,true);
  MallocMessageBuilder::~MallocMessageBuilder(&local_228);
  return;
}

Assistant:

void checkUpgradeToStruct(const schema::Type::Reader& type, uint64_t structTypeId,
                            kj::Maybe<schema::Node::Reader> matchSize = kj::none,
                            kj::Maybe<schema::Field::Reader> matchPosition = kj::none) {
    // We can't just look up the target struct and check it because it may not have been loaded
    // yet.  Instead, we contrive a struct that looks like what we want and load() that, which
    // guarantees that any incompatibility will be caught either now or when the real version of
    // that struct is loaded.

    word scratch[32];
    memset(scratch, 0, sizeof(scratch));
    MallocMessageBuilder builder(scratch);
    auto node = builder.initRoot<schema::Node>();
    node.setId(structTypeId);
    node.setDisplayName(kj::str("(unknown type used in ", nodeName, ")"));
    auto structNode = node.initStruct();

    switch (type.which()) {
      case schema::Type::VOID:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(0);
        break;

      case schema::Type::BOOL:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT8:
      case schema::Type::UINT8:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT16:
      case schema::Type::UINT16:
      case schema::Type::ENUM:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT32:
      case schema::Type::UINT32:
      case schema::Type::FLOAT32:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT64:
      case schema::Type::UINT64:
      case schema::Type::FLOAT64:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::LIST:
      case schema::Type::STRUCT:
      case schema::Type::INTERFACE:
      case schema::Type::ANY_POINTER:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(1);
        break;
    }

    KJ_IF_SOME(s, matchSize) {
      auto match = s.getStruct();
      structNode.setDataWordCount(match.getDataWordCount());
      structNode.setPointerCount(match.getPointerCount());
    }

    auto field = structNode.initFields(1)[0];
    field.setName("member0");
    field.setCodeOrder(0);
    auto slot = field.initSlot();
    slot.setType(type);

    KJ_IF_SOME(p, matchPosition) {
      if (p.getOrdinal().isExplicit()) {
        field.getOrdinal().setExplicit(p.getOrdinal().getExplicit());
      } else {
        field.getOrdinal().setImplicit();
      }
      auto matchSlot = p.getSlot();
      slot.setOffset(matchSlot.getOffset());
      slot.setDefaultValue(matchSlot.getDefaultValue());
    } else {
      field.getOrdinal().setExplicit(0);
      slot.setOffset(0);

      schema::Value::Builder value = slot.initDefaultValue();
      switch (type.which()) {
        case schema::Type::VOID: value.setVoid(); break;
        case schema::Type::BOOL: value.setBool(false); break;
        case schema::Type::INT8: value.setInt8(0); break;
        case schema::Type::INT16: value.setInt16(0); break;
        case schema::Type::INT32: value.setInt32(0); break;
        case schema::Type::INT64: value.setInt64(0); break;
        case schema::Type::UINT8: value.setUint8(0); break;
        case schema::Type::UINT16: value.setUint16(0); break;
        case schema::Type::UINT32: value.setUint32(0); break;
        case schema::Type::UINT64: value.setUint64(0); break;
        case schema::Type::FLOAT32: value.setFloat32(0); break;
        case schema::Type::FLOAT64: value.setFloat64(0); break;
        case schema::Type::ENUM: value.setEnum(0); break;
        case schema::Type::TEXT: value.adoptText(Orphan<Text>()); break;
        case schema::Type::DATA: value.adoptData(Orphan<Data>()); break;
        case schema::Type::LIST: value.initList(); break;
        case schema::Type::STRUCT: value.initStruct(); break;
        case schema::Type::INTERFACE: value.setInterface(); break;
        case schema::Type::ANY_POINTER: value.initAnyPointer(); break;
      }
    }